

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pesawat.h
# Opt level: O0

void __thiscall Pesawat::Pesawat(Pesawat *this)

{
  Point<double> local_578;
  Point<double> local_560;
  Point<double> local_548;
  Point<double> local_530;
  Point<double> local_518;
  Point<double> local_500;
  Point<double> local_4e8;
  Point<double> local_4d0;
  Point<double> local_4b8;
  Point<double> local_4a0;
  Point<double> local_488;
  Point<double> local_470;
  Point<double> local_458;
  Point<double> local_440;
  Point<double> local_428;
  Point<double> local_410;
  Point<double> local_3f8;
  Point<double> local_3e0;
  Point<double> local_3c8;
  Point<double> local_3b0;
  Point<double> local_398;
  Point<double> local_380;
  Point<double> local_368;
  Point<double> local_350;
  Point<double> local_338;
  Point<double> local_320;
  Point<double> local_308;
  Point<double> local_2f0;
  Point<double> local_2d8;
  Point<double> local_2c0;
  Point<double> local_2a8;
  Point<double> local_290;
  Point<double> local_278;
  Point<double> local_260;
  Point<double> local_248;
  Point<double> local_230;
  Point<double> local_218;
  Point<double> local_200;
  Point<double> local_1e8;
  Point<double> local_1d0;
  Point<double> local_1b8;
  Point<double> local_1a0;
  Point<double> local_188;
  Point<double> local_170;
  Point<double> local_158;
  Point<double> local_140;
  Point<double> local_128;
  Point<double> local_110;
  Point<double> local_f8;
  Point<double> local_e0;
  Point<double> local_c8;
  Point<double> local_b0;
  Point<double> local_98;
  Point<double> local_80;
  Point<double> local_68;
  Point<double> local_50;
  Point<double> local_28;
  Pesawat *local_10;
  Pesawat *this_local;
  
  local_10 = this;
  Polygon::Polygon(&this->super_Polygon);
  Point<double>::Point(&local_28,450.0,200.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_50,460.0,200.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_68,460.0,210.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_80,470.0,210.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_98,470.0,220.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_b0,480.0,220.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_c8,480.0,230.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_e0,490.0,230.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_f8,490.0,240.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_110,500.0,240.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_128,500.0,290.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_140,750.0,290.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_158,750.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_170,700.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_188,700.0,310.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1a0,500.0,310.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1b8,500.0,360.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1d0,490.0,360.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1e8,490.0,370.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_200,480.0,370.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_218,480.0,380.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_230,470.0,380.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_248,470.0,390.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_260,460.0,390.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_278,460.0,400.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_290,340.0,400.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2a8,340.0,390.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2c0,330.0,390.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2d8,330.0,380.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2f0,320.0,380.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_308,320.0,370.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_320,310.0,370.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_338,310.0,360.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_350,300.0,360.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_368,300.0,310.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_380,100.0,310.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_398,100.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3b0,50.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3c8,50.0,290.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3e0,300.0,290.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3f8,300.0,240.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_410,310.0,240.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_428,310.0,230.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_440,320.0,230.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_458,320.0,220.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_470,330.0,220.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_488,330.0,210.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4a0,340.0,210.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4b8,340.0,200.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4d0,390.0,200.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4e8,390.0,140.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_500,395.0,140.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_518,395.0,100.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_530,405.0,100.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_548,405.0,140.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_560,410.0,140.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_578,410.0,200.0,0.0);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

Pesawat() {
    addPoint(Point<double>(450,200));
    addPoint(Point<double>(460,200));
    addPoint(Point<double>(460,210));
    addPoint(Point<double>(470,210));
    addPoint(Point<double>(470,220));
    addPoint(Point<double>(480,220));
    addPoint(Point<double>(480,230));
    addPoint(Point<double>(490,230));
    addPoint(Point<double>(490,240));
    addPoint(Point<double>(500,240));
    addPoint(Point<double>(500,290));
    addPoint(Point<double>(750,290));
    addPoint(Point<double>(750,300));
    addPoint(Point<double>(700,300));
    addPoint(Point<double>(700,310));
    addPoint(Point<double>(500,310));
    addPoint(Point<double>(500,360));
    addPoint(Point<double>(490,360));
    addPoint(Point<double>(490,370));
    addPoint(Point<double>(480,370));
    addPoint(Point<double>(480,380));
    addPoint(Point<double>(470,380));
    addPoint(Point<double>(470,390));
    addPoint(Point<double>(460,390));
    addPoint(Point<double>(460,400));
    addPoint(Point<double>(340,400));
    addPoint(Point<double>(340,390));
    addPoint(Point<double>(330,390));
    addPoint(Point<double>(330,380));
    addPoint(Point<double>(320,380));
    addPoint(Point<double>(320,370));
    addPoint(Point<double>(310,370));
    addPoint(Point<double>(310,360));
    addPoint(Point<double>(300,360));
    addPoint(Point<double>(300,310));
    addPoint(Point<double>(100,310));
    addPoint(Point<double>(100,300));
    addPoint(Point<double>(50,300));
    addPoint(Point<double>(50,290));
    addPoint(Point<double>(300,290));
    addPoint(Point<double>(300,240));
    addPoint(Point<double>(310,240));
    addPoint(Point<double>(310,230));
    addPoint(Point<double>(320,230));
    addPoint(Point<double>(320,220));
    addPoint(Point<double>(330,220));
    addPoint(Point<double>(330,210));
    addPoint(Point<double>(340,210));
    addPoint(Point<double>(340,200));
    addPoint(Point<double>(390,200));
    addPoint(Point<double>(390,140));
    addPoint(Point<double>(395,140));
    addPoint(Point<double>(395,100));
    addPoint(Point<double>(405,100));
    addPoint(Point<double>(405,140));
    addPoint(Point<double>(410,140));
    addPoint(Point<double>(410,200));
  }